

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

ElementMatcherPairs *
testing::internal::FindMaxBipartiteMatching
          (ElementMatcherPairs *__return_storage_ptr__,MatchMatrix *g)

{
  MaxBipartiteMatchState local_50;
  MatchMatrix *local_18;
  MatchMatrix *g_local;
  
  local_18 = g;
  g_local = (MatchMatrix *)__return_storage_ptr__;
  MaxBipartiteMatchState::MaxBipartiteMatchState(&local_50,g);
  MaxBipartiteMatchState::Compute(__return_storage_ptr__,&local_50);
  MaxBipartiteMatchState::~MaxBipartiteMatchState(&local_50);
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ElementMatcherPairs
FindMaxBipartiteMatching(const MatchMatrix& g) {
  return MaxBipartiteMatchState(g).Compute();
}